

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O1

bool __thiscall assembler::SessionPDU::completeHeader(SessionPDU *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *b;
  HeaderMap *this_00;
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  SZ_com_t_s *pSVar3;
  RiceCompressionHeader RVar4;
  SZ_com_t_s *pSVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  ImageStructureHeader IVar8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  _Stack_58;
  
  b = &this->buf_;
  lrit::getHeaderMap((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &_Stack_58,b);
  this_00 = &this->m_;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear(&this_00->_M_t);
  if (_Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &_Stack_58._M_impl.super__Rb_tree_header;
    (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(this->m_)._M_t._M_impl.super__Rb_tree_header._M_header;
    (this->m_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_58._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&_Stack_58);
  sVar2 = (this->m_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((sVar2 != 0) && ((this->ph_).fileType == '\0')) {
    IVar8 = lrit::getHeader<lrit::ImageStructureHeader>(b,this_00);
    if ((IVar8._8_4_ & 0xff0000) == 0x10000) {
      p_Var1 = &(this->m_)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < 0x83])
      {
        if (0x82 < (int)p_Var7[1]._M_color) {
          p_Var6 = p_Var7;
        }
      }
      p_Var7 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var7 = p_Var6, 0x83 < (int)p_Var6[1]._M_color)
         ) {
        p_Var7 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var7 != p_Var1) {
        RVar4 = lrit::getHeader<lrit::RiceCompressionHeader>(b,this_00);
        pSVar5 = (SZ_com_t_s *)operator_new(0x10);
        pSVar3 = (this->szParam_)._M_t.
                 super___uniq_ptr_impl<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>._M_t.
                 super__Tuple_impl<0UL,_SZ_com_t_s_*,_std::default_delete<SZ_com_t_s>_>.
                 super__Head_base<0UL,_SZ_com_t_s_*,_false>._M_head_impl;
        (this->szParam_)._M_t.super___uniq_ptr_impl<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>.
        _M_t.super__Tuple_impl<0UL,_SZ_com_t_s_*,_std::default_delete<SZ_com_t_s>_>.
        super__Head_base<0UL,_SZ_com_t_s_*,_false>._M_head_impl = pSVar5;
        if (pSVar3 != (SZ_com_t_s *)0x0) {
          operator_delete(pSVar3,0x10);
        }
        pSVar3 = (this->szParam_)._M_t.
                 super___uniq_ptr_impl<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>._M_t.
                 super__Tuple_impl<0UL,_SZ_com_t_s_*,_std::default_delete<SZ_com_t_s>_>.
                 super__Head_base<0UL,_SZ_com_t_s_*,_false>._M_head_impl;
        pSVar3->options_mask = RVar4._4_4_ & 0xffff | 0x80;
        pSVar3->bits_per_pixel = IVar8._4_4_ & 0xff;
        pSVar3->pixels_per_block = RVar4._6_2_ & 0xff;
        pSVar3->pixels_per_scanline = (uint)IVar8.columns;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->szTmp_,IVar8._0_8_ >> 0x30);
      }
    }
  }
  return sVar2 != 0;
}

Assistant:

bool SessionPDU::completeHeader() {
  m_ = lrit::getHeaderMap(buf_);
  if (m_.empty()) {
    return false;
  }

  // File type 0 is image data
  if (ph_.fileType != 0) {
    return true;
  }

  // Check compression flag.
  // If it is anything other than "1" we ignore it.
  auto ish = lrit::getHeader<lrit::ImageStructureHeader>(buf_, m_);
  if (ish.compression != 1) {
    return true;
  }

  // Quote from 5_LRIT_Mission-data.pdf (next to Figure 6)
  //
  //   If the image data is Rice compressed, then the compression
  //   flag, CFLG in the Image Structure Record will be set to a "1".
  //   For uncompressed data, this value will be "0". If the data is
  //   Rice compressed, then a third secondary header must be decoded
  //   to obtain the Rice compression parameters. This is the NOAA
  //   specific Rice Compression Record with a header type equal to
  //   "131" as shown in Figure 6.
  //
  // Therefore, we should now check if this buffer has a Rice
  // compression header and setup the decoder if so.
  //
  if (lrit::hasHeader<lrit::RiceCompressionHeader>(m_)) {
    auto rch = lrit::getHeader<lrit::RiceCompressionHeader>(buf_, m_);
    szParam_.reset(new SZ_com_t);
    szParam_->options_mask = rch.flags | SZ_RAW_OPTION_MASK;
    szParam_->bits_per_pixel = ish.bitsPerPixel;
    szParam_->pixels_per_block = rch.pixelsPerBlock;
    szParam_->pixels_per_scanline = ish.columns;
    szTmp_.resize(szParam_->pixels_per_scanline);
  }

  return true;
}